

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CAddress * GetBindAddress(Sock *sock)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  long *in_RSI;
  CAddress *in_RDI;
  long in_FS_OFFSET;
  CAddress *addr_bind;
  socklen_t sockaddr_bind_len;
  sockaddr_storage sockaddr_bind;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  sockaddr *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  CAddress *this;
  LogFlags in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  undefined4 local_8c;
  undefined1 local_88 [32];
  ConstevalFormatString<0U> in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  CAddress::CAddress(in_RDI);
  local_8c = 0x80;
  iVar3 = (**(code **)(*in_RSI + 0x58))(in_RSI,local_88,&local_8c);
  if (iVar3 == 0) {
    CService::SetSockAddr
              ((CService *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
  }
  else {
    uVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),Trace);
    if ((bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(uVar2,in_stack_ffffffffffffff00));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(uVar2,in_stack_ffffffffffffff00));
      LogPrintFormatInternal<>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff5c,
                 in_stack_ffffffffffffff50,sockaddr_bind._0_4_,in_stack_ffffffffffffff98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CAddress GetBindAddress(const Sock& sock)
{
    CAddress addr_bind;
    struct sockaddr_storage sockaddr_bind;
    socklen_t sockaddr_bind_len = sizeof(sockaddr_bind);
    if (!sock.GetSockName((struct sockaddr*)&sockaddr_bind, &sockaddr_bind_len)) {
        addr_bind.SetSockAddr((const struct sockaddr*)&sockaddr_bind);
    } else {
        LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "getsockname failed\n");
    }
    return addr_bind;
}